

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O2

LY_ERR yin_parse_element_generic(lysp_yin_ctx *ctx,ly_stmt parent_stmt,lysp_stmt **element)

{
  uint uVar1;
  int iVar2;
  LY_ERR LVar3;
  ly_stmt current_element;
  ly_stmt lVar4;
  lysp_stmt *plVar5;
  size_t sVar6;
  char *pcVar7;
  yin_argument arg_type;
  lysp_stmt **pplVar8;
  char **arg_val;
  ly_ctx *plVar9;
  lyxml_ctx *plVar10;
  char *pcVar11;
  lysp_stmt *plVar12;
  lysp_stmt *local_40;
  char *id;
  
  local_40 = (lysp_stmt *)0x0;
  if (ctx->xmlctx->status != LYXML_ELEMENT) {
    __assert_fail("ctx->xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                  ,0xc9e,
                  "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                 );
  }
  plVar5 = (lysp_stmt *)calloc(1,0x38);
  *element = plVar5;
  plVar10 = ctx->xmlctx;
  if (plVar5 == (lysp_stmt *)0x0) {
    plVar9 = plVar10->ctx;
LAB_00180f58:
    ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_element_generic");
    return LY_EMEM;
  }
  if ((plVar10->field_4).prefix_len == 0) {
    LVar3 = lydict_insert(plVar10->ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                          (char **)plVar5);
  }
  else {
    iVar2 = asprintf(&id,"%.*s:%.*s",(plVar10->field_4).prefix_len,(plVar10->field_3).prefix,
                     (plVar10->field_6).name_len,(plVar10->field_5).name);
    plVar9 = ctx->xmlctx->ctx;
    if (iVar2 == -1) goto LAB_00180f58;
    LVar3 = lydict_insert_zc(plVar9,id,&(*element)->stmt);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    plVar10 = ctx->xmlctx;
    plVar9 = plVar10->ctx;
    plVar5 = *element;
    pcVar11 = plVar5->stmt;
    sVar6 = strlen(pcVar11);
    LVar3 = ly_store_prefix_data
                      (plVar9,pcVar11,sVar6,LY_VALUE_XML,&plVar10->ns,&plVar5->format,
                       &plVar5->prefix_data);
  }
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  plVar10 = ctx->xmlctx;
  current_element =
       yin_match_keyword(ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                         (plVar10->field_3).prefix,(plVar10->field_4).prefix_len,parent_stmt);
  plVar5 = *element;
  plVar5->kw = current_element;
  plVar12 = plVar5->child;
  if (current_element == LY_STMT_EXTENSION_INSTANCE) {
    LVar3 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    plVar5 = (lysp_stmt *)0x0;
    while (plVar10 = ctx->xmlctx, plVar10->status == LYXML_ATTRIBUTE) {
      plVar5 = (lysp_stmt *)calloc(1,0x38);
      if (plVar5 == (lysp_stmt *)0x0) {
        plVar9 = plVar10->ctx;
        goto LAB_00180f58;
      }
      pplVar8 = &plVar12->next;
      if ((*element)->child == (lysp_stmt *)0x0) {
        pplVar8 = &(*element)->child;
      }
      *pplVar8 = plVar5;
      plVar5->flags = 0x400;
      LVar3 = lydict_insert(plVar10->ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                            (char **)plVar5);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      plVar5->kw = LY_STMT_NONE;
      pcVar11 = (ctx->xmlctx->field_3).prefix;
      LVar3 = lyxml_ctx_next(ctx->xmlctx);
      if (pcVar11 == (char *)0x0) {
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        plVar10 = ctx->xmlctx;
        if ((plVar10->field_6).dynamic == '\0') {
          pcVar11 = "";
          if ((plVar10->field_4).prefix_len != 0) {
            pcVar11 = (plVar10->field_3).prefix;
          }
          LVar3 = lydict_insert(plVar10->ctx,pcVar11,(plVar10->field_4).prefix_len,&plVar5->arg);
        }
        else {
          LVar3 = lydict_insert_zc(plVar10->ctx,(plVar10->field_3).prefix,&plVar5->arg);
        }
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        (ctx->xmlctx->field_6).dynamic = '\0';
        if (plVar5->arg == (char *)0x0) {
          return LY_EMEM;
        }
      }
      else if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      LVar3 = lyxml_ctx_next(ctx->xmlctx);
      plVar12 = plVar5;
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    goto LAB_0018159c;
  }
  if (current_element == LY_STMT_NONE) {
    plVar9 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    uVar1 = *(uint *)&ctx->xmlctx->field_6;
    pcVar11 = (ctx->xmlctx->field_5).name;
    pcVar7 = lyplg_ext_stmt2str(parent_stmt);
    goto LAB_00180ff8;
  }
  LVar3 = lyxml_ctx_next(ctx->xmlctx);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  arg_val = &plVar5->arg;
  switch(current_element) {
  case LY_STMT_NOTIFICATION:
  case LY_STMT_ACTION:
switchD_00181566_caseD_1:
    arg_type = YIN_ARG_NAME;
LAB_0018158f:
    LVar3 = yin_parse_attribute(ctx,arg_type,arg_val,Y_MAYBE_STR_ARG,current_element);
    break;
  case LY_STMT_INPUT:
  case LY_STMT_OUTPUT:
    arg_type = YIN_ARG_NONE;
    goto LAB_0018158f;
  case LY_STMT_INPUT|LY_STMT_NOTIFICATION:
  case LY_STMT_OUTPUT|LY_STMT_NOTIFICATION:
  case LY_STMT_OUTPUT|LY_STMT_INPUT:
  case LY_STMT_OUTPUT|LY_STMT_INPUT|LY_STMT_NOTIFICATION:
switchD_00181566_caseD_3:
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c",
           0xc88);
    return LY_EINT;
  default:
    if ((current_element - LY_STMT_RPC < 0x31) &&
       ((0x1000000010001U >> ((ulong)(current_element - LY_STMT_RPC) & 0x3f) & 1) != 0))
    goto switchD_00181566_caseD_1;
    if (current_element == LY_STMT_AUGMENT) {
LAB_00181666:
      arg_type = YIN_ARG_TARGET_NODE;
      goto LAB_0018158f;
    }
    if ((((((current_element == LY_STMT_CASE) || (current_element == LY_STMT_CHOICE)) ||
          (current_element == LY_STMT_CONTAINER)) ||
         ((current_element == LY_STMT_GROUPING || (current_element == LY_STMT_LEAF)))) ||
        (current_element == LY_STMT_LEAF_LIST)) ||
       (((current_element == LY_STMT_LIST || (current_element == LY_STMT_USES)) ||
        ((current_element == LY_STMT_ARGUMENT || (current_element == LY_STMT_BASE))))))
    goto switchD_00181566_caseD_1;
    if (current_element == LY_STMT_BELONGS_TO) {
LAB_00181659:
      arg_type = YIN_ARG_MODULE;
      goto LAB_0018158f;
    }
    if (current_element == LY_STMT_BIT) goto switchD_00181566_caseD_1;
    if (current_element == LY_STMT_CONFIG) {
LAB_0018149a:
      arg_type = YIN_ARG_VALUE;
      goto LAB_0018158f;
    }
    if (current_element != LY_STMT_CONTACT) {
      if (current_element == LY_STMT_DEFAULT) goto LAB_0018149a;
      if (current_element == LY_STMT_DESCRIPTION) goto LAB_001814b4;
      if (current_element == LY_STMT_DEVIATE) goto LAB_0018149a;
      if (current_element == LY_STMT_DEVIATION) goto LAB_00181666;
      if (current_element == LY_STMT_ENUM) goto switchD_00181566_caseD_1;
      if (current_element == LY_STMT_ERROR_APP_TAG) goto LAB_0018149a;
      if (current_element == LY_STMT_ERROR_MESSAGE) goto LAB_001814b4;
      if ((current_element == LY_STMT_EXTENSION) || (current_element == LY_STMT_FEATURE))
      goto switchD_00181566_caseD_1;
      if (current_element == LY_STMT_FRACTION_DIGITS) goto LAB_0018149a;
      if ((current_element == LY_STMT_IDENTITY) || (current_element == LY_STMT_IF_FEATURE))
      goto switchD_00181566_caseD_1;
      if ((current_element == LY_STMT_IMPORT) || (current_element == LY_STMT_INCLUDE))
      goto LAB_00181659;
      if ((((current_element == LY_STMT_KEY) || (current_element == LY_STMT_LENGTH)) ||
          (current_element == LY_STMT_MANDATORY)) ||
         (((current_element == LY_STMT_MAX_ELEMENTS || (current_element == LY_STMT_MIN_ELEMENTS)) ||
          (current_element == LY_STMT_MODIFIER)))) goto LAB_0018149a;
      if (current_element == LY_STMT_MODULE) goto switchD_00181566_caseD_1;
      if (current_element == LY_STMT_MUST) {
LAB_00181674:
        arg_type = YIN_ARG_CONDITION;
      }
      else {
        if (current_element != LY_STMT_NAMESPACE) {
          if (current_element != LY_STMT_ORDERED_BY) {
            if (current_element == LY_STMT_ORGANIZATION) goto LAB_001814b4;
            if (((current_element != LY_STMT_PATH) && (current_element != LY_STMT_PATTERN)) &&
               ((current_element != LY_STMT_POSITION &&
                (((current_element != LY_STMT_PREFIX && (current_element != LY_STMT_PRESENCE)) &&
                 (current_element != LY_STMT_RANGE)))))) {
              if (current_element == LY_STMT_REFERENCE) goto LAB_001814b4;
              if (current_element == LY_STMT_REFINE) goto LAB_00181666;
              if (current_element != LY_STMT_REQUIRE_INSTANCE) {
                if ((current_element == LY_STMT_REVISION) ||
                   (current_element == LY_STMT_REVISION_DATE)) {
                  arg_type = YIN_ARG_DATE;
                  goto LAB_0018158f;
                }
                if (current_element != LY_STMT_STATUS) {
                  if (((current_element == LY_STMT_SUBMODULE) || (current_element == LY_STMT_TYPE))
                     || (current_element == LY_STMT_TYPEDEF)) goto switchD_00181566_caseD_1;
                  if (current_element == LY_STMT_UNIQUE) {
                    arg_type = YIN_ARG_TAG;
                    current_element = LY_STMT_UNIQUE;
                    goto LAB_0018158f;
                  }
                  if ((current_element != LY_STMT_YIN_ELEMENT) && (current_element != LY_STMT_VALUE)
                     ) {
                    if (current_element == LY_STMT_WHEN) goto LAB_00181674;
                    if (current_element != LY_STMT_YANG_VERSION) {
                      if (current_element != LY_STMT_UNITS) goto switchD_00181566_caseD_3;
                      goto switchD_00181566_caseD_1;
                    }
                  }
                }
              }
            }
          }
          goto LAB_0018149a;
        }
        arg_type = YIN_ARG_URI;
        current_element = LY_STMT_NAMESPACE;
      }
      goto LAB_0018158f;
    }
LAB_001814b4:
    LVar3 = yin_parse_attribute(ctx,YIN_ARG_NONE,arg_val,Y_MAYBE_STR_ARG,current_element);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    plVar10 = ctx->xmlctx;
    if (plVar10->status != LYXML_ELEM_CONTENT) {
      __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CONTENT",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                    ,0xc65,
                    "LY_ERR yin_parse_extension_instance_arg(struct lysp_yin_ctx *, enum ly_stmt, const char **)"
                   );
    }
    if ((plVar10->field_5).ws_only == '\0') {
LAB_001814ff:
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      pcVar11 = "text";
      if (current_element == LY_STMT_ERROR_MESSAGE) {
        pcVar11 = "value";
      }
      pcVar7 = lyplg_ext_stmt2str(current_element);
      ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YIN,
              "Sub-element \"%s\" of \"%s\" element must be defined as it\'s first sub-element.",
              pcVar11,pcVar7);
      return LY_EVALID;
    }
    LVar3 = lyxml_ctx_next(plVar10);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    plVar10 = ctx->xmlctx;
    if (plVar10->status != LYXML_ELEMENT) goto LAB_001814ff;
    lVar4 = yin_match_keyword(ctx,(plVar10->field_5).name,(plVar10->field_6).name_len,
                              (plVar10->field_3).prefix,(plVar10->field_4).prefix_len,
                              current_element);
    if (((current_element == LY_STMT_ERROR_MESSAGE) && (lVar4 != LY_STMT_ARG_VALUE)) ||
       ((current_element != LY_STMT_ERROR_MESSAGE && (lVar4 != LY_STMT_ARG_TEXT)))) {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      uVar1 = *(uint *)&ctx->xmlctx->field_6;
      pcVar11 = (ctx->xmlctx->field_5).name;
      pcVar7 = lyplg_ext_stmt2str(current_element);
LAB_00180ff8:
      ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YIN,
              "Unexpected sub-element \"%.*s\" of \"%s\" element.",(ulong)uVar1,pcVar11,pcVar7);
      return LY_EVALID;
    }
    LVar3 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    while (plVar10 = ctx->xmlctx, plVar10->status == LYXML_ATTRIBUTE) {
      LVar3 = lyxml_ctx_next(plVar10);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      LVar3 = lyxml_ctx_next(ctx->xmlctx);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    if ((plVar10->field_6).dynamic == '\0') {
      if ((plVar10->field_4).prefix_len == 0) {
        pcVar11 = "";
      }
      else {
        pcVar11 = (plVar10->field_3).prefix;
      }
      LVar3 = lydict_insert(plVar10->ctx,pcVar11,(plVar10->field_4).prefix_len,arg_val);
    }
    else {
      LVar3 = lydict_insert_zc(plVar10->ctx,(plVar10->field_3).prefix,arg_val);
    }
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    (ctx->xmlctx->field_6).dynamic = '\0';
    if (*arg_val == (char *)0x0) {
      return LY_EMEM;
    }
    LVar3 = lyxml_ctx_next(ctx->xmlctx);
  }
  plVar5 = local_40;
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
LAB_0018159c:
  local_40 = plVar5;
  plVar10 = ctx->xmlctx;
  if ((plVar10->status == LYXML_ELEM_CONTENT) && ((plVar10->field_5).ws_only == '\0')) {
    if ((plVar10->field_4).prefix_len != 0) {
      if ((plVar10->field_6).dynamic == '\0') {
        LVar3 = lydict_insert(plVar10->ctx,(plVar10->field_3).prefix,(plVar10->field_4).prefix_len,
                              &(*element)->arg);
      }
      else {
        LVar3 = lydict_insert_zc(plVar10->ctx,(plVar10->field_3).prefix,&(*element)->arg);
      }
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      (ctx->xmlctx->field_6).dynamic = '\0';
      plVar5 = *element;
      pcVar11 = plVar5->arg;
      if (pcVar11 == (char *)0x0) {
        return LY_EMEM;
      }
      plVar10 = ctx->xmlctx;
      plVar9 = plVar10->ctx;
      sVar6 = strlen(pcVar11);
      LVar3 = ly_store_prefix_data
                        (plVar9,pcVar11,sVar6,LY_VALUE_XML,&plVar10->ns,&plVar5->format,
                         &plVar5->prefix_data);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      plVar10 = ctx->xmlctx;
    }
    LVar3 = lyxml_ctx_next(plVar10);
  }
  else {
    LVar3 = lyxml_ctx_next(plVar10);
    if (LVar3 == LY_SUCCESS) {
      do {
        if (ctx->xmlctx->status != LYXML_ELEMENT) {
          return LY_SUCCESS;
        }
        LVar3 = yin_parse_element_generic(ctx,(*element)->kw,&local_40);
        plVar5 = local_40;
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        pplVar8 = &plVar12->next;
        if ((*element)->child == (lysp_stmt *)0x0) {
          pplVar8 = &(*element)->child;
        }
        *pplVar8 = local_40;
        if (ctx->xmlctx->status != LYXML_ELEM_CLOSE) {
          __assert_fail("ctx->xmlctx->status == LYXML_ELEM_CLOSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yin.c"
                        ,0xcf0,
                        "LY_ERR yin_parse_element_generic(struct lysp_yin_ctx *, enum ly_stmt, struct lysp_stmt **)"
                       );
        }
        LVar3 = lyxml_ctx_next(ctx->xmlctx);
        plVar12 = plVar5;
      } while (LVar3 == LY_SUCCESS);
    }
  }
  return LVar3;
}

Assistant:

LY_ERR
yin_parse_element_generic(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_stmt **element)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_stmt *last = NULL, *new = NULL;
    char *id;

    assert(ctx->xmlctx->status == LYXML_ELEMENT);

    /* allocate new structure for element */
    *element = calloc(1, sizeof(**element));
    LY_CHECK_ERR_GOTO(!(*element), LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);

    /* store identifier */
    if (ctx->xmlctx->prefix_len) {
        if (asprintf(&id, "%.*s:%.*s", (int)ctx->xmlctx->prefix_len, ctx->xmlctx->prefix, (int)ctx->xmlctx->name_len,
                ctx->xmlctx->name) == -1) {
            LOGMEM(ctx->xmlctx->ctx);
            ret = LY_EMEM;
            goto cleanup;
        }
        LY_CHECK_GOTO(ret = lydict_insert_zc(ctx->xmlctx->ctx, id, &(*element)->stmt), cleanup);

        /* store prefix data for the statement */
        LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->stmt, strlen((*element)->stmt), LY_VALUE_XML,
                &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
    } else {
        LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &(*element)->stmt), cleanup);
    }

    (*element)->kw = yin_match_keyword(ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, ctx->xmlctx->prefix,
            ctx->xmlctx->prefix_len, parent_stmt);

    last = (*element)->child;
    if ((*element)->kw == LY_STMT_NONE) {
        /* unrecognized element */
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_UNEXP_SUBELEM, (int)ctx->xmlctx->name_len, ctx->xmlctx->name,
                lyplg_ext_stmt2str(parent_stmt));
        ret = LY_EVALID;
        goto cleanup;
    } else if ((*element)->kw != LY_STMT_EXTENSION_INSTANCE) {
        /* element is known yang keyword, which means argument can be parsed correctly. */
        ret = yin_parse_extension_instance_arg(ctx, (*element)->kw, &(*element)->arg);
        LY_CHECK_GOTO(ret, cleanup);
    } else {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

        /* load attributes in generic way, save all attributes in linked list */
        while (ctx->xmlctx->status == LYXML_ATTRIBUTE) {
            new = calloc(1, sizeof(*last));
            LY_CHECK_ERR_GOTO(!new, LOGMEM(ctx->xmlctx->ctx); ret = LY_EMEM, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            last->flags |= LYS_YIN_ATTR;
            LY_CHECK_GOTO(ret = lydict_insert(ctx->xmlctx->ctx, ctx->xmlctx->name, ctx->xmlctx->name_len, &last->stmt), cleanup);
            last->kw = LY_STMT_NONE;
            /* attributes with prefix are ignored */
            if (!ctx->xmlctx->prefix) {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);

                INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, last->arg);
                LY_CHECK_ERR_GOTO(!last->arg, ret = LY_EMEM, cleanup);
            } else {
                LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
            }
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    }

    if ((ctx->xmlctx->status != LYXML_ELEM_CONTENT) || ctx->xmlctx->ws_only) {
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        while (ctx->xmlctx->status == LYXML_ELEMENT) {
            /* parse subelements */
            ret = yin_parse_element_generic(ctx, (*element)->kw, &new);
            LY_CHECK_GOTO(ret, cleanup);
            if (!(*element)->child) {
                /* save first */
                (*element)->child = new;
            } else {
                last->next = new;
            }
            last = new;

            assert(ctx->xmlctx->status == LYXML_ELEM_CLOSE);
            LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
        }
    } else {
        /* save element content */
        if (ctx->xmlctx->value_len) {
            INSERT_STRING_RET(ctx->xmlctx->ctx, ctx->xmlctx->value, ctx->xmlctx->value_len, ctx->xmlctx->dynamic, (*element)->arg);
            LY_CHECK_ERR_GOTO(!(*element)->arg, ret = LY_EMEM, cleanup);

            /* store prefix data for the argument as well */
            LY_CHECK_GOTO(ret = ly_store_prefix_data(ctx->xmlctx->ctx, (*element)->arg, strlen((*element)->arg), LY_VALUE_XML,
                    &ctx->xmlctx->ns, &(*element)->format, &(*element)->prefix_data), cleanup);
        }

        /* read closing tag */
        LY_CHECK_GOTO(ret = lyxml_ctx_next(ctx->xmlctx), cleanup);
    }

cleanup:
    return ret;
}